

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__input____input_local_offset_type
          (LibraryControllersLoader15 *this)

{
  input____input_local_offset_type__AttributeData *in_stack_00000038;
  LibraryControllersLoader15 *in_stack_00000040;
  
  begin__input____input_local_offset_type(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

bool LibraryControllersLoader15::begin__input____input_local_offset_type( const COLLADASaxFWL15::input____input_local_offset_type__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__input____input_local_offset_type(attributeData));
COLLADASaxFWL::input____InputLocalOffset__AttributeData attrData;
attrData.present_attributes = 0;
attrData.semantic = attributeData.semantic;
attrData.source = attributeData.source;
if ( (attributeData.present_attributes & COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_OFFSET_PRESENT) == COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_OFFSET_PRESENT ) {
    attrData.offset = attributeData.offset;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_SET_PRESENT) == COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_SET_PRESENT ) {
    attrData.set = attributeData.set;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT;
}
return mLoader->begin__input____InputLocalOffset(attrData);
}